

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMfs.c
# Opt level: O3

void Abc_NtkReinsertNodes(Abc_Ntk_t *p,Abc_Ntk_t *pNtk,int iPivot)

{
  Abc_Obj_t *pObj;
  void *pvVar1;
  long *plVar2;
  int iVar3;
  Vec_Ptr_t *__ptr;
  char *pcVar4;
  Vec_Ptr_t *pVVar5;
  uint uVar6;
  int iVar7;
  ulong uVar8;
  long lVar9;
  long lVar10;
  
  if (p->ntkType != ABC_NTK_LOGIC) {
    __assert_fail("Abc_NtkIsLogic(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMfs.c"
                  ,0x173,"void Abc_NtkReinsertNodes(Abc_Ntk_t *, Abc_Ntk_t *, int)");
  }
  if (pNtk->vCis->nSize < p->vCis->nSize) {
    __assert_fail("Abc_NtkCiNum(p) <= Abc_NtkCiNum(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMfs.c"
                  ,0x174,"void Abc_NtkReinsertNodes(Abc_Ntk_t *, Abc_Ntk_t *, int)");
  }
  __ptr = Abc_NtkDfs(p,0);
  Abc_NtkCleanCopy(p);
  pVVar5 = p->vObjs;
  if (0 < pVVar5->nSize) {
    lVar9 = 0;
    do {
      pObj = (Abc_Obj_t *)pVVar5->pArray[lVar9];
      if ((pObj != (Abc_Obj_t *)0x0) && ((*(uint *)&pObj->field_0x14 & 0xf) == 7)) {
        Abc_ObjRemoveFanins(pObj);
        pcVar4 = Abc_SopRegister((Mem_Flex_t *)p->pManFunc," 0\n");
        (pObj->field_5).pData = pcVar4;
        pVVar5 = p->vObjs;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < pVVar5->nSize);
  }
  pVVar5 = p->vCis;
  iVar7 = pVVar5->nSize;
  if (0 < iVar7) {
    lVar9 = 0;
    do {
      if (pNtk->vCis->nSize <= lVar9) goto LAB_002d611a;
      *(void **)((long)pNtk->vCis->pArray[lVar9] + 0x40) = pVVar5->pArray[lVar9];
      lVar9 = lVar9 + 1;
      pVVar5 = p->vCis;
      iVar7 = pVVar5->nSize;
    } while (lVar9 < iVar7);
  }
  iVar3 = __ptr->nSize;
  if (iVar7 + iVar3 + p->vPos->nSize != iPivot) {
    __assert_fail("Vec_PtrSize(vNodes) + Abc_NtkCiNum(p) + Abc_NtkPoNum(p) == iPivot",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMfs.c"
                  ,0x181,"void Abc_NtkReinsertNodes(Abc_Ntk_t *, Abc_Ntk_t *, int)");
  }
  if (0 < iVar3) {
    lVar9 = 0;
    do {
      uVar6 = p->vCis->nSize;
      if ((int)((int)lVar9 + uVar6) < -1) goto LAB_002d611a;
      uVar8 = (ulong)uVar6 + lVar9 + 1;
      if (pNtk->vObjs->nSize <= (int)uVar8) goto LAB_002d611a;
      pvVar1 = pNtk->vObjs->pArray[uVar8 & 0xffffffff];
      if (pvVar1 != (void *)0x0) {
        *(void **)((long)pvVar1 + 0x40) = __ptr->pArray[lVar9];
        iVar3 = __ptr->nSize;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 < iVar3);
    if (0 < iVar3) {
      lVar9 = 0;
      do {
        iVar7 = p->vCis->nSize;
        if (iVar7 + (int)lVar9 < -1) {
LAB_002d611a:
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        uVar6 = iVar7 + (int)lVar9 + 1;
        if (pNtk->vObjs->nSize <= (int)uVar6) goto LAB_002d611a;
        plVar2 = (long *)pNtk->vObjs->pArray[uVar6];
        if (plVar2 != (long *)0x0) {
          pvVar1 = __ptr->pArray[lVar9];
          if ((void *)plVar2[8] != pvVar1) {
            __assert_fail("pNodeNew->pCopy == pNode",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/abci/abcMfs.c"
                          ,399,"void Abc_NtkReinsertNodes(Abc_Ntk_t *, Abc_Ntk_t *, int)");
          }
          if (0 < *(int *)((long)plVar2 + 0x1c)) {
            lVar10 = 0;
            do {
              Abc_ObjAddFanin((Abc_Obj_t *)plVar2[8],
                              *(Abc_Obj_t **)
                               (*(long *)(*(long *)(*(long *)(*plVar2 + 0x20) + 8) +
                                         (long)*(int *)(plVar2[4] + lVar10 * 4) * 8) + 0x40));
              lVar10 = lVar10 + 1;
            } while (lVar10 < *(int *)((long)plVar2 + 0x1c));
          }
          pcVar4 = Abc_SopRegister((Mem_Flex_t *)p->pManFunc,(char *)plVar2[7]);
          *(char **)((long)pvVar1 + 0x38) = pcVar4;
          iVar3 = __ptr->nSize;
        }
        lVar9 = lVar9 + 1;
      } while (lVar9 < iVar3);
    }
  }
  if (__ptr->pArray != (void **)0x0) {
    free(__ptr->pArray);
  }
  free(__ptr);
  return;
}

Assistant:

void Abc_NtkReinsertNodes( Abc_Ntk_t * p, Abc_Ntk_t * pNtk, int iPivot )
{
    Abc_Obj_t * pNode, * pNodeNew, * pFaninNew;
    Vec_Ptr_t * vNodes;
    int i, k;
    assert( Abc_NtkIsLogic(p) );
    assert( Abc_NtkCiNum(p) <= Abc_NtkCiNum(pNtk) );
    vNodes = Abc_NtkDfs( p, 0 );
    // clean old network
    Abc_NtkCleanCopy( p );
    Abc_NtkForEachNode( p, pNode, i )
    {
        Abc_ObjRemoveFanins( pNode );
        pNode->pData = Abc_SopRegister( (Mem_Flex_t *)p->pManFunc, (char *)" 0\n" );
    }
    // map CIs
    Abc_NtkForEachCi( p, pNode, i )
        Abc_NtkCi(pNtk, i)->pCopy = pNode;
    // map internal nodes
    assert( Vec_PtrSize(vNodes) + Abc_NtkCiNum(p) + Abc_NtkPoNum(p) == iPivot );
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        pNodeNew = Abc_NtkObj( pNtk, Abc_NtkCiNum(p) + i + 1 );
        if ( pNodeNew == NULL )
            continue;
        pNodeNew->pCopy = pNode;
    }
    // connect internal nodes
    Vec_PtrForEachEntry( Abc_Obj_t *, vNodes, pNode, i )
    {
        pNodeNew = Abc_NtkObj( pNtk, Abc_NtkCiNum(p) + i + 1 );
        if ( pNodeNew == NULL )
            continue;
        assert( pNodeNew->pCopy == pNode );
        Abc_ObjForEachFanin( pNodeNew, pFaninNew, k )
            Abc_ObjAddFanin( pNodeNew->pCopy, pFaninNew->pCopy );
        pNode->pData = Abc_SopRegister( (Mem_Flex_t *)p->pManFunc, (char *)pNodeNew->pData );
    }
    Vec_PtrFree( vNodes );
}